

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

ZSobolSampler *
pbrt::ZSobolSampler::Create
          (ParameterDictionary *parameters,Point2i fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ZSobolSampler *pZVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string s;
  RandomizeStrategy randomizer;
  int seed;
  int nsamp;
  string *in_stack_fffffffffffffea8;
  ParameterDictionary *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  Point2<int> *args_1;
  polymorphic_allocator<std::byte> *this;
  allocator<char> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_fffffffffffffee8;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  string *name;
  ParameterDictionary *in_stack_ffffffffffffff08;
  string local_f0 [39];
  undefined8 local_c9;
  string local_a8 [32];
  undefined4 local_88;
  allocator<char> local_81;
  string local_80 [32];
  int local_60;
  undefined1 local_49 [37];
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  name = (string *)local_49;
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  local_24 = iVar3;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x44));
  if (bVar1) {
    piVar5 = pstd::optional<int>::operator*((optional<int> *)0x95c02f);
    local_24 = *piVar5;
  }
  if ((*(byte *)(Options + 0x54) & 1) != 0) {
    local_24 = 1;
  }
  __s = &local_81;
  args = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  iVar4 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  this = (polymorphic_allocator<std::byte> *)&local_c9;
  local_60 = iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  args_1 = (Point2<int> *)&stack0xffffffffffffff0f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  ParameterDictionary::GetOneString(in_stack_ffffffffffffff08,name,in_RDI);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  std::__cxx11::string::~string((string *)((long)&local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
  if ((bool)uVar2) {
    local_88 = 0;
  }
  else {
    in_stack_fffffffffffffebe =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    if ((bool)in_stack_fffffffffffffebe) {
      local_88 = 1;
    }
    else {
      in_stack_fffffffffffffebd =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
      if ((bool)in_stack_fffffffffffffebd) {
        local_88 = 2;
      }
      else {
        in_stack_fffffffffffffebc =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
        if (!(bool)in_stack_fffffffffffffebc) {
          ErrorExit<std::__cxx11::string&>
                    ((FileLoc *)CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,args);
        }
        local_88 = 3;
      }
    }
  }
  pZVar6 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::ZSobolSampler,int&,pbrt::Point2<int>&,pbrt::RandomizeStrategy&,int&>
                     (this,(int *)local_18,args_1,
                      (RandomizeStrategy *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffebe,
                                              CONCAT15(in_stack_fffffffffffffebd,
                                                       CONCAT14(in_stack_fffffffffffffebc,
                                                                in_stack_fffffffffffffeb8)))),
                      (int *)in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_a8);
  return pZVar6;
}

Assistant:

ZSobolSampler *ZSobolSampler::Create(const ParameterDictionary &parameters,
                                     Point2i fullResolution, const FileLoc *loc,
                                     Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to ZSobolSampler", s);

    return alloc.new_object<ZSobolSampler>(nsamp, fullResolution, randomizer, seed);
}